

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnGlobalSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index global_index)

{
  string_view local_60;
  ObjdumpSymbol local_50;
  
  local_60.size_ = name.size_;
  local_60.data_ = name.data_;
  if (local_60.size_ != 0) {
    SetGlobalName(this,global_index,name);
  }
  local_50.kind = Global;
  string_view::to_string_abi_cxx11_(&local_50.name,&local_60);
  local_50.index = global_index;
  ObjdumpSymbol::operator=
            ((((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab).
             super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
             super__Vector_impl_data._M_start + index,&local_50);
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result OnGlobalSymbol(Index index,
                        uint32_t flags,
                        string_view name,
                        Index global_index) override {
    if (!name.empty()) {
      SetGlobalName(global_index, name);
    }
    objdump_state_->symtab[index] = {SymbolType::Global, name.to_string(),
                                     global_index};
    return Result::Ok;
  }